

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

uint256 * ComputeTapbranchHash
                    (uint256 *__return_storage_ptr__,Span<const_unsigned_char> a,
                    Span<const_unsigned_char> b)

{
  base_blob<256U> *pbVar1;
  int iVar2;
  long lVar3;
  uchar *data;
  long lVar4;
  ulong len;
  ulong __n;
  uchar *data_00;
  uint32_t *puVar5;
  CSHA256 *pCVar6;
  ulong len_00;
  size_t __len2;
  size_t __len1;
  long in_FS_OFFSET;
  bool bVar7;
  HashWriter ss_branch;
  CSHA256 local_a0;
  long local_38;
  
  len_00 = b.m_size;
  data = b.m_data;
  len = a.m_size;
  data_00 = a.m_data;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (uint32_t *)&HASHER_TAPBRANCH;
  pCVar6 = &local_a0;
  local_38 = lVar3;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pCVar6->s = *(undefined8 *)puVar5;
    puVar5 = puVar5 + 2;
    pCVar6 = (CSHA256 *)(pCVar6->s + 2);
  }
  __n = len;
  if (len_00 < len) {
    __n = len_00;
  }
  if (__n == 0) {
    bVar7 = true;
  }
  else {
    iVar2 = memcmp(data_00,data,__n);
    bVar7 = iVar2 == 0;
    lVar3 = (long)iVar2;
  }
  lVar4 = len - len_00;
  if (!bVar7) {
    lVar4 = lVar3;
  }
  if (lVar4 < 0) {
    CSHA256::Write(&local_a0,data_00,len);
  }
  else {
    CSHA256::Write(&local_a0,data,len_00);
    len_00 = len;
    data = data_00;
  }
  CSHA256::Write(&local_a0,data,len_00);
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  (pbVar1->m_data)._M_elems[0x1c] = '\0';
  (pbVar1->m_data)._M_elems[0x1d] = '\0';
  (pbVar1->m_data)._M_elems[0x1e] = '\0';
  (pbVar1->m_data)._M_elems[0x1f] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar1 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  CSHA256::Finalize(&local_a0,(uchar *)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ComputeTapbranchHash(Span<const unsigned char> a, Span<const unsigned char> b)
{
    HashWriter ss_branch{HASHER_TAPBRANCH};
    if (std::lexicographical_compare(a.begin(), a.end(), b.begin(), b.end())) {
        ss_branch << a << b;
    } else {
        ss_branch << b << a;
    }
    return ss_branch.GetSHA256();
}